

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_lobster.cpp
# Opt level: O2

void __thiscall
flatbuffers::lobster::LobsterGenerator::GenEnum
          (LobsterGenerator *this,EnumDef *enum_def,string *code_ptr)

{
  EnumVal *ev;
  pointer ppEVar1;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  if ((enum_def->super_Definition).generated == false) {
    CheckNameSpace(this,&enum_def->super_Definition,code_ptr);
    GenComment(&(enum_def->super_Definition).doc_comment,code_ptr,(CommentConfig *)0x0,"");
    EscapeKeyword(&local_130,this,(string *)enum_def);
    std::operator+(&local_110,"enum ",&local_130);
    std::operator+(&local_f0,&local_110,":\n");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    for (ppEVar1 = (enum_def->vals).vec.
                   super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppEVar1 !=
        (enum_def->vals).vec.
        super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppEVar1 = ppEVar1 + 1) {
      ev = *ppEVar1;
      GenComment(&ev->doc_comment,code_ptr,(CommentConfig *)0x0,"    ");
      std::operator+(&local_b0,"    ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)enum_def);
      std::operator+(&local_d0,&local_b0,"_");
      EscapeKeyword(&local_50,this,&ev->name);
      std::operator+(&local_90,&local_d0,&local_50);
      std::operator+(&local_130,&local_90," = ");
      EnumDef::ToString_abi_cxx11_(&local_70,enum_def,ev);
      std::operator+(&local_110,&local_130,&local_70);
      std::operator+(&local_f0,&local_110,"\n");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    std::__cxx11::string::append((char *)code_ptr);
  }
  return;
}

Assistant:

void GenEnum(const EnumDef &enum_def, std::string *code_ptr) {
    if (enum_def.generated) return;
    std::string &code = *code_ptr;
    CheckNameSpace(enum_def, &code);
    GenComment(enum_def.doc_comment, code_ptr, nullptr, "");
    code += "enum " + NormalizedName(enum_def) + ":\n";
    for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end(); ++it) {
      auto &ev = **it;
      GenComment(ev.doc_comment, code_ptr, nullptr, "    ");
      code += "    " + enum_def.name + "_" + NormalizedName(ev) + " = " +
              enum_def.ToString(ev) + "\n";
    }
    code += "\n";
  }